

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall
httplib::detail::MultipartFormDataParser::set_boundary
          (MultipartFormDataParser *this,string *boundary)

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  ::std::__cxx11::string::_M_assign((string *)&this->boundary_);
  ::std::operator+(&local_68,&this->dash_,&this->boundary_);
  plVar1 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(this->crlf_)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)&this->dash_boundary_crlf_,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  ::std::operator+(&local_68,&this->crlf_,&this->dash_);
  plVar1 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(this->boundary_)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)&this->crlf_dash_boundary_,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void set_boundary(std::string &&boundary) {
    boundary_ = boundary;
    dash_boundary_crlf_ = dash_ + boundary_ + crlf_;
    crlf_dash_boundary_ = crlf_ + dash_ + boundary_;
  }